

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O1

void __thiscall
Layer::set_labels(Layer *this,
                 initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *labels)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pPVar4;
  iterator label;
  bool bVar5;
  
  pPVar4 = (this->m_perceptrons).super__Vector_base<Perceptron,_std::allocator<Perceptron>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->m_perceptrons).super__Vector_base<Perceptron,_std::allocator<Perceptron>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar4) {
    label = labels->_M_array;
    uVar2 = 0;
    uVar3 = 1;
    do {
      if (label == labels->_M_array + labels->_M_len) {
        return;
      }
      Perceptron::set_label(pPVar4 + uVar2,label);
      label = label + 1;
      pPVar4 = (this->m_perceptrons).super__Vector_base<Perceptron,_std::allocator<Perceptron>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = ((long)(this->m_perceptrons).
                     super__Vector_base<Perceptron,_std::allocator<Perceptron>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pPVar4 >> 4) * -0x3333333333333333;
      bVar5 = uVar3 <= uVar2;
      lVar1 = uVar2 - uVar3;
      uVar2 = uVar3;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (bVar5 && lVar1 != 0);
  }
  return;
}

Assistant:

void  Layer::set_labels(const std::initializer_list<std::string>& labels){
    auto label=labels.begin();
    for(uint i=0;i<m_perceptrons.size() && label!=labels.end();++i, ++label){
        m_perceptrons[i].set_label(*label);
    }
}